

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O1

bool __thiscall SGParser::Generator::Lex::MakeDFAUsingNFA(Lex *this,DFAGen *dfa)

{
  uint uVar1;
  pointer pbVar2;
  pointer ppNVar3;
  size_t sVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  iterator iVar8;
  NFA *pNVar9;
  mapped_type *ppNVar10;
  long lVar11;
  pointer pEVar12;
  _Rb_tree_node_base *p_Var13;
  ulong uVar14;
  ulong uVar15;
  pointer __k;
  undefined1 auVar16 [8];
  undefined1 auVar17 [8];
  undefined1 auStack_198 [8];
  DFAGen dfa2;
  undefined1 local_d8 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>_>
  macroNFAs;
  undefined1 local_a0 [8];
  NFA combinedNFA;
  undefined1 auStack_58 [8];
  vector<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_> lexemeNFAList;
  
  macroNFAs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&macroNFAs;
  macroNFAs._M_t._M_impl._0_4_ = 0;
  macroNFAs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  macroNFAs._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  macroNFAs._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  __k = (this->MacroNames).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->MacroNames).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  macroNFAs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       macroNFAs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if ((long)pbVar2 - (long)__k >> 5 !=
      (this->Macros)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    __assert_fail("MacroNames.size() == Macros.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/ParserGen/Lex.cpp"
                  ,0x41e,"bool SGParser::Generator::Lex::MakeDFAUsingNFA(DFAGen &)");
  }
  if (__k != pbVar2) {
    do {
      iVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)this,__k);
      if ((_Rb_tree_header *)iVar8._M_node == &(this->Macros)._M_t._M_impl.super__Rb_tree_header) {
        __assert_fail("iter != Macros.end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/ParserGen/Lex.cpp"
                      ,0x421,"bool SGParser::Generator::Lex::MakeDFAUsingNFA(DFAGen &)");
      }
      pNVar9 = (NFA *)operator_new(0x28);
      pNVar9->LexemeId = 0xffffffff;
      pNVar9->pStartState = (NFANode *)0x0;
      (pNVar9->FinalState).
      super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pNVar9->FinalState).
      super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pNVar9->FinalState).
      super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar5 = MakeNFA(this,pNVar9,(String *)(iVar8._M_node + 2),
                      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>_>
                       *)local_d8);
      if (bVar5) {
        ppNVar10 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>_>
                                 *)local_d8,__k);
        *ppNVar10 = pNVar9;
      }
      else {
        NFA::~NFA(pNVar9);
        operator_delete(pNVar9,0x28);
      }
      __k = __k + 1;
    } while (__k != pbVar2);
  }
  lVar11 = (long)(this->Lexemes).
                 super__Vector_base<SGParser::Lexeme,_std::allocator<SGParser::Lexeme>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->Lexemes).
                 super__Vector_base<SGParser::Lexeme,_std::allocator<SGParser::Lexeme>_>._M_impl.
                 super__Vector_impl_data._M_start;
  if ((lVar11 != 0) &&
     ((this->Expressions).
      super__Vector_base<SGParser::Generator::Lex::Expression,_std::allocator<SGParser::Generator::Lex::Expression>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->Expressions).
      super__Vector_base<SGParser::Generator::Lex::Expression,_std::allocator<SGParser::Generator::Lex::Expression>_>
      ._M_impl.super__Vector_impl_data._M_start)) {
    auStack_198 = (undefined1  [8])((ulong)(uint)((int)(lVar11 >> 3) * -0x3b13b13b) << 0x20);
    std::
    vector<SGParser::Generator::Lex::Expression,_std::allocator<SGParser::Generator::Lex::Expression>_>
    ::emplace_back<SGParser::Generator::Lex::Expression>
              (&this->Expressions,(Expression *)auStack_198);
  }
  auStack_58 = (undefined1  [8])0x0;
  lexemeNFAList.
  super__Vector_base<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  lexemeNFAList.
  super__Vector_base<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  dfa2.super_DFA.CharTable._0_8_ =
       &dfa2.super_DFA.CharTable.values._M_h._M_rehash_policy._M_next_resize;
  dfa2.super_DFA.ExpressionStartStates.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dfa2.super_DFA.ExpressionStartStates.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dfa2.super_DFA.LexemeInfos.
  super__Vector_base<SGParser::LexemeInfo,_std::allocator<SGParser::LexemeInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dfa2.super_DFA.LexemeInfos.
  super__Vector_base<SGParser::LexemeInfo,_std::allocator<SGParser::LexemeInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dfa2.super_DFA.AcceptStates.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dfa2.super_DFA.LexemeInfos.
  super__Vector_base<SGParser::LexemeInfo,_std::allocator<SGParser::LexemeInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dfa2.super_DFA.AcceptStates.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  dfa2.super_DFA.AcceptStates.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  dfa2.super_DFA.TransitionTable.
  super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  dfa2.super_DFA.TransitionTable.
  super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auStack_198._0_4_ = 0;
  auStack_198._4_4_ = 0;
  dfa2.super_DFA.TransitionTable.
  super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  dfa2.super_DFA.ExpressionStartStates.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0xffffffff;
  dfa2.super_DFA.CharTable.values._M_h._M_buckets = (__buckets_ptr)0x1;
  dfa2.super_DFA.CharTable.values._M_h._M_bucket_count = 0;
  dfa2.super_DFA.CharTable.values._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  dfa2.super_DFA.CharTable.values._M_h._M_element_count._0_4_ = 0x3f800000;
  dfa2.super_DFA.CharTable.values._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  dfa2.super_DFA.CharTable.values._M_h._M_rehash_policy._4_4_ = 0;
  dfa2.super_DFA.CharTable.values._M_h._M_rehash_policy._M_next_resize = 0;
  dfa2.super_DFA.CharTable.values._M_h._M_single_bucket._0_4_ = 0xff;
  dfa2.Messages.Flags = 0;
  dfa2.Messages._4_4_ = 0;
  dfa2.Messages.pMessages = (Messages *)0x0;
  pEVar12 = (this->Expressions).
            super__Vector_base<SGParser::Generator::Lex::Expression,_std::allocator<SGParser::Generator::Lex::Expression>_>
            ._M_impl.super__Vector_impl_data._M_start;
  bVar5 = (this->Expressions).
          super__Vector_base<SGParser::Generator::Lex::Expression,_std::allocator<SGParser::Generator::Lex::Expression>_>
          ._M_impl.super__Vector_impl_data._M_finish == pEVar12;
  p_Var13 = macroNFAs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (!bVar5) {
    combinedNFA.FinalState.
    super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&this->Lexemes;
    uVar14 = 0;
    do {
      uVar1 = pEVar12[uVar14].StartLexeme;
      uVar15 = (ulong)uVar1;
      uVar7 = pEVar12[uVar14].LexemeCount + uVar1;
      macroNFAs._M_t._M_impl.super__Rb_tree_header._M_node_count = uVar14;
      if (uVar1 < uVar7) {
        do {
          local_a0 = (undefined1  [8])operator_new(0x28);
          ((NFA *)local_a0)->LexemeId = (int)uVar15 + 2;
          ((NFA *)local_a0)->pStartState = (NFANode *)0x0;
          (((NFA *)local_a0)->FinalState).
          super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (((NFA *)local_a0)->FinalState).
          super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (((NFA *)local_a0)->FinalState).
          super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          bVar6 = MakeNFA(this,(NFA *)local_a0,
                          &(this->Lexemes).
                           super__Vector_base<SGParser::Lexeme,_std::allocator<SGParser::Lexeme>_>.
                           _M_impl.super__Vector_impl_data._M_start[uVar15].RegularExpression,
                          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>_>
                           *)local_d8);
          if (bVar6) {
            if (lexemeNFAList.
                super__Vector_base<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                lexemeNFAList.
                super__Vector_base<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              std::vector<SGParser::Generator::NFA*,std::allocator<SGParser::Generator::NFA*>>::
              _M_realloc_insert<SGParser::Generator::NFA*const&>
                        ((vector<SGParser::Generator::NFA*,std::allocator<SGParser::Generator::NFA*>>
                          *)auStack_58,
                         (iterator)
                         lexemeNFAList.
                         super__Vector_base<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,(NFA **)local_a0);
            }
            else {
              *lexemeNFAList.
               super__Vector_base<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>
               ._M_impl.super__Vector_impl_data._M_start = (NFA *)local_a0;
              lexemeNFAList.
              super__Vector_base<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   lexemeNFAList.
                   super__Vector_base<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1;
            }
          }
          else {
            CheckForErrorAndReport
                      (this,"Failed to make an NFA from the \'%s\' expression.",
                       (this->Lexemes).
                       super__Vector_base<SGParser::Lexeme,_std::allocator<SGParser::Lexeme>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar15].RegularExpression.
                       _M_dataplus._M_p);
            auVar17 = local_a0;
            auVar16 = auStack_58;
            ppNVar3 = lexemeNFAList.
                      super__Vector_base<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (local_a0 != (undefined1  [8])0x0) {
              NFA::~NFA((NFA *)local_a0);
              operator_delete((void *)auVar17,0x28);
              auVar16 = auStack_58;
              ppNVar3 = lexemeNFAList.
                        super__Vector_base<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            }
            for (; auVar16 != (undefined1  [8])ppNVar3;
                auVar16 = (undefined1  [8])((long)auVar16 + 8)) {
              pNVar9 = *(NFA **)auVar16;
              if (pNVar9 != (NFA *)0x0) {
                NFA::~NFA(pNVar9);
                operator_delete(pNVar9,0x28);
              }
            }
          }
          if (!bVar6) goto LAB_0013eade;
          uVar15 = uVar15 + 1;
        } while (uVar15 != uVar7);
      }
      local_a0._0_4_ = 1;
      combinedNFA.FinalState.
      super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      combinedNFA.FinalState.
      super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      combinedNFA.LexemeId = 0;
      combinedNFA._4_4_ = 0;
      combinedNFA.pStartState = (NFANode *)0x0;
      NFA::CombineNFAs((NFA *)local_a0,
                       (vector<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>
                        *)auStack_58);
      ppNVar3 = lexemeNFAList.
                super__Vector_base<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      sVar4 = macroNFAs._M_t._M_impl.super__Rb_tree_header._M_node_count;
      for (auVar17 = auStack_58; auVar17 != (undefined1  [8])ppNVar3;
          auVar17 = (undefined1  [8])((long)auVar17 + 8)) {
        pNVar9 = *(NFA **)auVar17;
        if (pNVar9 != (NFA *)0x0) {
          NFA::~NFA(pNVar9);
          operator_delete(pNVar9,0x28);
        }
      }
      if ((undefined1  [8])
          lexemeNFAList.
          super__Vector_base<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>
          ._M_impl.super__Vector_impl_data._M_start != auStack_58) {
        lexemeNFAList.
        super__Vector_base<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)auStack_58;
      }
      if (sVar4 == 0) {
        DFAGen::Create(dfa,(NFA *)local_a0,
                       (vector<SGParser::Lexeme,_std::allocator<SGParser::Lexeme>_> *)
                       combinedNFA.FinalState.
                       super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,0x100);
      }
      else {
        DFAGen::Create((DFAGen *)auStack_198,(NFA *)local_a0,
                       (vector<SGParser::Lexeme,_std::allocator<SGParser::Lexeme>_> *)
                       combinedNFA.FinalState.
                       super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (int)(dfa->super_DFA).CharTable.values._M_h._M_element_count - 1);
        bVar6 = DFAGen::Combine(dfa,(DFAGen *)auStack_198);
        if (!bVar6) {
          CheckForErrorAndReport(this,"Failed to combine DFAs.");
          NFA::~NFA((NFA *)local_a0);
          goto LAB_0013eade;
        }
      }
      NFA::~NFA((NFA *)local_a0);
      uVar14 = sVar4 + 1;
      pEVar12 = (this->Expressions).
                super__Vector_base<SGParser::Generator::Lex::Expression,_std::allocator<SGParser::Generator::Lex::Expression>_>
                ._M_impl.super__Vector_impl_data._M_start;
      bVar6 = uVar14 < (ulong)((long)(this->Expressions).
                                     super__Vector_base<SGParser::Generator::Lex::Expression,_std::allocator<SGParser::Generator::Lex::Expression>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar12 >> 3
                              );
      bVar5 = !bVar6;
      p_Var13 = macroNFAs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    } while (bVar6);
  }
  for (; p_Var13 != (_Rb_tree_node_base *)&macroNFAs;
      p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
    pNVar9 = *(NFA **)(p_Var13 + 2);
    if (pNVar9 != (NFA *)0x0) {
      NFA::~NFA(pNVar9);
      operator_delete(pNVar9,0x28);
    }
  }
LAB_0013eade:
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&dfa2.super_DFA.CharTable);
  if (dfa2.super_DFA.LexemeInfos.
      super__Vector_base<SGParser::LexemeInfo,_std::allocator<SGParser::LexemeInfo>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(dfa2.super_DFA.LexemeInfos.
                    super__Vector_base<SGParser::LexemeInfo,_std::allocator<SGParser::LexemeInfo>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                    (long)dfa2.super_DFA.ExpressionStartStates.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)dfa2.super_DFA.LexemeInfos.
                          super__Vector_base<SGParser::LexemeInfo,_std::allocator<SGParser::LexemeInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  if (dfa2.super_DFA.AcceptStates.
      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(dfa2.super_DFA.AcceptStates.
                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    (long)dfa2.super_DFA.LexemeInfos.
                          super__Vector_base<SGParser::LexemeInfo,_std::allocator<SGParser::LexemeInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)dfa2.super_DFA.AcceptStates.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  if (dfa2.super_DFA.TransitionTable.
      super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(dfa2.super_DFA.TransitionTable.
                    super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    (long)dfa2.super_DFA.AcceptStates.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)dfa2.super_DFA.TransitionTable.
                          super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::~vector((vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
             *)auStack_198);
  if (auStack_58 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_58,
                    (long)lexemeNFAList.
                          super__Vector_base<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_58);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>_>
               *)local_d8);
  return bVar5;
}

Assistant:

bool Lex::MakeDFAUsingNFA(DFAGen& dfa) {
    // Store the macro NFAs
    std::map<String, NFA*> macroNFAs;

    // Go through all macros (in declaration-order) and create NFA's for them.
    // ("In declaration-order" so a lexically-later macro can refer to a lexically-earlier macro.)
    SG_ASSERT(MacroNames.size() == Macros.size());
    for (const String& name : MacroNames) {
        auto const iter = Macros.find(name);
        SG_ASSERT(iter != Macros.end());
        auto const& regExp = iter->second;

        // Create a new nfa to be filled
        const auto pnfa = new NFA;

        // if the nfa failed to initialize then quite
        if (MakeNFA(*pnfa, regExp, macroNFAs))
            macroNFAs[name] = pnfa;
        else
            delete pnfa; // Should we report an error?
    }

    // If there are lexemes, but not a single expression
    // make an expression for them (special case)
    if (Lexemes.size() && !Expressions.size())
        Expressions.push_back({0u, unsigned(Lexemes.size())});

    // Go through all expression lexemes and construct a list of DFA
    std::vector<NFA*> lexemeNFAList;
    DFAGen            dfa2;

    for (size_t i = 0u; i < Expressions.size(); ++i) {
        // Store NFAs for this expression
        const auto EndLexeme = Expressions[i].StartLexeme + Expressions[i].LexemeCount;
        for (unsigned j = Expressions[i].StartLexeme; j < EndLexeme; ++j) {
            const auto pnfa = new NFA{j + TokenCode::TokenFirstID};

            // if the nfa failed to initialize then quit
            if (!MakeNFA(*pnfa, Lexemes[j].RegularExpression, macroNFAs)) {
                // ERROR: Making an NFA from RE failed, probably syntax error in RE
                CheckForErrorAndReport("Failed to make an NFA from the '%s' expression.",
                                       Lexemes[j].RegularExpression.data());

                // This seems to be necessary here in case of error
                delete pnfa;
                for (const auto nfa : lexemeNFAList)
                    delete nfa;

                return false;
            }

            lexemeNFAList.push_back(pnfa);
        }

        // Combine all the individual NFAs into one
        NFA combinedNFA{1u};
        combinedNFA.CombineNFAs(lexemeNFAList);

        for (const auto nfa: lexemeNFAList)
            delete nfa;
        lexemeNFAList.clear();

        // Make a DFA from the huge NFA
        // Should really have a more complex character-counting scheme!
        if (i == 0u)
            dfa.Create(combinedNFA, Lexemes, 256u);
        else {
            // And combine it to form an expression
            dfa2.Create(combinedNFA, Lexemes, unsigned(dfa.GetCharCount() - 1u));
            if (!dfa.Combine(dfa2)) {
                // ERROR: Failed to combine DFAs, probably inconsistent states
                CheckForErrorAndReport("Failed to combine DFAs.");
                return false;
            }
        }
    }

    // Free all the macro NFA's
    for (const auto& [_, nfa] : macroNFAs)
        delete nfa;

    return true;
}